

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O2

void __thiscall
Js::WebAssemblyEnvironment::SetGlobalInternal<float>
          (WebAssemblyEnvironment *this,uint32 offset,float val)

{
  float *ptr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  ptr = (float *)((long)&((this->start).ptr)->ptr + (ulong)offset * 4);
  CheckPtrIsValid<float>(this,(intptr_t)ptr);
  if ((*ptr != 0.0) || (NAN(*ptr))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0x93,"(*ptr == 0)",
                                "We shouldn\'t overwrite anything on the environment once it is set"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  *ptr = val;
  return;
}

Assistant:

void WebAssemblyEnvironment::SetGlobalInternal(uint32 offset, T val)
{
    Field(T)* ptr = (Field(T)*)PointerValue(start) + offset;
    CheckPtrIsValid<T>((intptr_t)PointerValue(ptr));
    AssertMsg(*ptr == 0, "We shouldn't overwrite anything on the environment once it is set");
    *ptr = val;
}